

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_sent_content_length
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *buf;
  u_char *puVar1;
  u_char *p;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  if ((r->headers_out).content_length == (ngx_table_elt_t *)0x0) {
    if ((r->headers_out).content_length_n < 0) {
      *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
      r_local = (ngx_http_request_t *)0x0;
    }
    else {
      buf = (u_char *)ngx_pnalloc(r->pool,0x14);
      if (buf == (u_char *)0x0) {
        r_local = (ngx_http_request_t *)0xffffffffffffffff;
      }
      else {
        puVar1 = ngx_sprintf(buf,"%O",(r->headers_out).content_length_n);
        *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar1 - (int)buf & 0xfffffffU;
        *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
        *(uint *)v = *(uint *)v & 0xdfffffff;
        *(uint *)v = *(uint *)v & 0xbfffffff;
        v->data = buf;
        r_local = (ngx_http_request_t *)0x0;
      }
    }
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 |
                 (uint)(((r->headers_out).content_length)->value).len & 0xfffffff;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = (((r->headers_out).content_length)->value).data;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_variable_sent_content_length(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char  *p;

    if (r->headers_out.content_length) {
        v->len = r->headers_out.content_length->value.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = r->headers_out.content_length->value.data;

        return NGX_OK;
    }

    if (r->headers_out.content_length_n >= 0) {
        p = ngx_pnalloc(r->pool, NGX_OFF_T_LEN);
        if (p == NULL) {
            return NGX_ERROR;
        }

        v->len = ngx_sprintf(p, "%O", r->headers_out.content_length_n) - p;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = p;

        return NGX_OK;
    }

    v->not_found = 1;

    return NGX_OK;
}